

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ArenaStringPtr::Set(ArenaStringPtr *this,string_view value,Arena *arena)

{
  void *pvVar1;
  TaggedStringPtr TVar2;
  undefined8 extraout_RAX;
  ulong uVar3;
  string *unaff_R12;
  string_view s;
  ArenaStringPtr local_30 [2];
  
  s._M_len = value._M_str;
  pvVar1 = (this->tagged_ptr_).ptr_;
  if (((ulong)pvVar1 & 3) != 0) {
    if (((ulong)pvVar1 & 2) == 0) {
      Set(local_30);
    }
    else {
      uVar3 = (ulong)pvVar1 & 0xfffffffffffffffc;
      if (uVar3 != 0) {
        std::__cxx11::string::_M_replace(uVar3,0,*(char **)(uVar3 + 8),(ulong)s._M_len);
        return;
      }
    }
    Set(local_30);
LAB_00149223:
    Set();
    operator_delete(unaff_R12,0x20);
    _Unwind_Resume(extraout_RAX);
  }
  if (arena == (Arena *)0x0) {
    unaff_R12 = (string *)operator_new(0x20);
    *(string **)unaff_R12 = unaff_R12 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              (unaff_R12,s._M_len,s._M_len + (long)&((Arena *)value._M_len)->impl_);
    if (((ulong)unaff_R12 & 3) != 0) goto LAB_00149223;
    TVar2.ptr_ = (void *)((ulong)unaff_R12 | 2);
  }
  else {
    s._M_str = (char *)arena;
    TVar2 = anon_unknown_8::CreateArenaString((anon_unknown_8 *)arena,(Arena *)value._M_len,s);
  }
  (this->tagged_ptr_).ptr_ = TVar2.ptr_;
  return;
}

Assistant:

void ArenaStringPtr::Set(absl::string_view value, Arena* arena) {
  ScopedCheckPtrInvariants check(&tagged_ptr_);
  if (IsDefault()) {
    // If we're not on an arena, skip straight to a true string to avoid
    // possible copy cost later.
    tagged_ptr_ = arena != nullptr ? CreateArenaString(*arena, value)
                                   : CreateString(value);
  } else {
    if (internal::DebugHardenForceCopyDefaultString()) {
      if (arena == nullptr) {
        auto* old = tagged_ptr_.GetIfAllocated();
        tagged_ptr_ = CreateString(value);
        delete old;
      } else {
        auto* old = UnsafeMutablePointer();
        tagged_ptr_ = CreateArenaString(*arena, value);
        old->assign("garbagedata");
      }
    } else {
      UnsafeMutablePointer()->assign(value.data(), value.length());
    }
  }
}